

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

void __thiscall rlib::JsonT<void>::Stringify::Format::Format(Format *this)

{
  allocator<char> local_19;
  
  (this->lf)._M_dataplus._M_p = (pointer)&(this->lf).field_2;
  (this->lf)._M_string_length = 0;
  (this->lf).field_2._M_local_buf[0] = '\0';
  (this->indent)._M_dataplus._M_p = (pointer)&(this->indent).field_2;
  (this->indent)._M_string_length = 0;
  (this->indent).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->colon,":",&local_19);
  return;
}

Assistant:

Format() {}